

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::OutboundTargetReached(CConnman *this,bool historicalBlockServingLimit)

{
  seconds sVar1;
  ulong uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock98;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = false;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_total_bytes_sent_mutex,
             "m_total_bytes_sent_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xe76,false);
  uVar2 = this->nMaxOutboundLimit;
  if (uVar2 != 0) {
    if (historicalBlockServingLimit) {
      sVar1 = GetMaxOutboundTimeLeftInCycle_(this);
      bVar3 = true;
      uVar2 = this->nMaxOutboundLimit + (sVar1.__r / 600) * -4000000;
      if (this->nMaxOutboundLimit < (ulong)((sVar1.__r / 600) * 4000000) || uVar2 == 0)
      goto LAB_00184538;
    }
    bVar3 = true;
    if (this->nMaxOutboundTotalBytesSentInCycle < uVar2) {
      bVar3 = false;
    }
  }
LAB_00184538:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CConnman::OutboundTargetReached(bool historicalBlockServingLimit) const
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    LOCK(m_total_bytes_sent_mutex);
    if (nMaxOutboundLimit == 0)
        return false;

    if (historicalBlockServingLimit)
    {
        // keep a large enough buffer to at least relay each block once
        const std::chrono::seconds timeLeftInCycle = GetMaxOutboundTimeLeftInCycle_();
        const uint64_t buffer = timeLeftInCycle / std::chrono::minutes{10} * MAX_BLOCK_SERIALIZED_SIZE;
        if (buffer >= nMaxOutboundLimit || nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit - buffer)
            return true;
    }
    else if (nMaxOutboundTotalBytesSentInCycle >= nMaxOutboundLimit)
        return true;

    return false;
}